

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

bool AString_replaceRangeAString(AString *str,size_t index,size_t count,AString *rep)

{
  ulong uVar1;
  bool bVar2;
  
  if (rep != (AString *)0x0) {
    bVar2 = AString_replaceRangeCString(str,index,count,rep->buffer,rep->size);
    return bVar2;
  }
  if (str == (AString *)0x0) {
    bVar2 = false;
  }
  else {
    uVar1 = str->size;
    bVar2 = true;
    if (index < uVar1) {
      if (count < ~index && count + index < uVar1) {
        str->size = uVar1 - count;
        memmove(str->buffer + index,str->buffer + index + count,((uVar1 - count) - index) + 1);
      }
      else {
        str->size = index;
        str->buffer[index] = '\0';
      }
    }
  }
  return bVar2;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeAString(struct AString *str, size_t index, size_t count, const struct AString *rep)
{
    if(rep == nullptr)
        return AString_replaceRangeCString(str, index, count, nullptr, 0);
    else
        return AString_replaceRangeCString(str, index, count, rep->buffer, rep->size);
}